

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio-logger.cpp
# Opt level: O2

bool __thiscall AudioLogger::record(AudioLogger *this,float bufferSize_s,int32_t nPrevFrames)

{
  _Head_base<0UL,_AudioLogger::Data_*,_false> _Var1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  float fVar11;
  
  uVar7 = (ulong)(uint)nPrevFrames;
  _Var1._M_head_impl =
       (this->data_)._M_t.
       super___uniq_ptr_impl<AudioLogger::Data,_std::default_delete<AudioLogger::Data>_>._M_t.
       super__Tuple_impl<0UL,_AudioLogger::Data_*,_std::default_delete<AudioLogger::Data>_>.
       super__Head_base<0UL,_AudioLogger::Data_*,_false>._M_head_impl;
  bVar3 = isValidBufferSize(this,bufferSize_s);
  if (bVar3) {
    fVar11 = (float)*(int64_t *)((long)&(_Var1._M_head_impl)->parameters + 0x28) * bufferSize_s *
             0.001953125;
    uVar2 = ((int)((int)fVar11 + (uint)(0.0 < fVar11 && (float)(int)fVar11 != fVar11)) / 2) * 2;
    if ((int)uVar2 < nPrevFrames) {
      bVar3 = false;
      fprintf(_stderr,
              "warning : invalid previous frames in record requested - %d. max allowed is %d s\n",
              uVar7,(ulong)uVar2);
    }
    else {
      std::mutex::lock((mutex *)&((pthread_mutex_t *)&(_Var1._M_head_impl)->mutex)->__data);
      lVar5 = (long)(_Var1._M_head_impl)->nRecords;
      bVar3 = lVar5 != 0x10;
      if (lVar5 == 0x10) {
        fprintf(_stderr,"warning : max number of simultaneous records %d reached\n",0x10);
      }
      else {
        lVar5 = lVar5 * 0x18;
        if (*(pointer *)((long)&(_Var1._M_head_impl)->records + lVar5 + 8U) ==
            *(pointer *)((long)&(_Var1._M_head_impl)->records + lVar5)) {
          iVar4 = (_Var1._M_head_impl)->bufferId - nPrevFrames;
          iVar6 = iVar4 + 0x3ab;
          if (-1 < iVar4) {
            iVar6 = iVar4;
          }
          uVar9 = (ulong)iVar6;
          if (nPrevFrames < 1) {
            uVar7 = 0;
          }
          lVar8 = (long)&(_Var1._M_head_impl)->buffer + uVar9 * 0x800;
          while( true ) {
            bVar10 = uVar7 == 0;
            uVar7 = uVar7 - 1;
            if (bVar10) break;
            std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>::
            push_back((vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>
                       *)((long)&(_Var1._M_head_impl)->records + lVar5),
                      (value_type *)((uVar9 / 0x3ab) * -0x1d5800 + lVar8));
            lVar8 = lVar8 + 0x800;
            uVar9 = uVar9 + 1;
          }
        }
        else {
          fwrite("warning : new record requested before last has been processed. should never happen\n"
                 ,0x53,1,_stderr);
        }
        *(uint *)((long)&(_Var1._M_head_impl)->nFramesToRecord +
                 (long)(_Var1._M_head_impl)->nRecords * 4) = (uVar2 - nPrevFrames) + 1;
        (_Var1._M_head_impl)->nRecords = (_Var1._M_head_impl)->nRecords + 1;
      }
      pthread_mutex_unlock((pthread_mutex_t *)&(_Var1._M_head_impl)->mutex);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool AudioLogger::record(float bufferSize_s, int32_t nPrevFrames) {
    auto & data = getData();

    if (isValidBufferSize(bufferSize_s) == false) {
        return false;
    }

    auto bufferSize_frames = getBufferSize_frames(data.parameters.sampleRate, bufferSize_s);

    if (nPrevFrames >= bufferSize_frames) {
        fprintf(stderr, "warning : invalid previous frames in record requested - %d. max allowed is %d s\n", nPrevFrames, bufferSize_frames - 1);
        return false;
    }

    std::lock_guard<std::mutex> lock(data.mutex);

    if (data.nRecords == kMaxRecords) {
        fprintf(stderr, "warning : max number of simultaneous records %d reached\n", kMaxRecords);
        return false;
    }

    auto & record = data.records[data.nRecords];

    if (record.size() == 0) {
        int fStart = data.bufferId - nPrevFrames;
        if (fStart < 0) fStart += data.buffer.size();
        for (int i = 0; i < nPrevFrames; ++i) {
            record.push_back(data.buffer[(fStart + i)%data.buffer.size()]);
        }
    } else {
        fprintf(stderr, "warning : new record requested before last has been processed. should never happen\n");
    }

    data.nFramesToRecord[data.nRecords] = bufferSize_frames - nPrevFrames;

    ++data.nRecords;

    return true;
}